

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMBaseInfo.h
# Opt level: O0

char * ARM_ISB_InstSyncBOptToString(uint val)

{
  uint val_local;
  char *local_8;
  
  switch(val) {
  default:
    local_8 = "#0x0";
    break;
  case 1:
    local_8 = "#0x1";
    break;
  case 2:
    local_8 = "#0x2";
    break;
  case 3:
    local_8 = "#0x3";
    break;
  case 4:
    local_8 = "#0x4";
    break;
  case 5:
    local_8 = "#0x5";
    break;
  case 6:
    local_8 = "#0x6";
    break;
  case 7:
    local_8 = "#0x7";
    break;
  case 8:
    local_8 = "#0x8";
    break;
  case 9:
    local_8 = "#0x9";
    break;
  case 10:
    local_8 = "#0xa";
    break;
  case 0xb:
    local_8 = "#0xb";
    break;
  case 0xc:
    local_8 = "#0xc";
    break;
  case 0xd:
    local_8 = "#0xd";
    break;
  case 0xe:
    local_8 = "#0xe";
    break;
  case 0xf:
    local_8 = "sy";
  }
  return local_8;
}

Assistant:

inline static const char *ARM_ISB_InstSyncBOptToString(unsigned val)
{
	switch (val) {
		default: // never reach
		case ARM_ISB_RESERVED_0:  return "#0x0";
		case ARM_ISB_RESERVED_1:  return "#0x1";
		case ARM_ISB_RESERVED_2:  return "#0x2";
		case ARM_ISB_RESERVED_3:  return "#0x3";
		case ARM_ISB_RESERVED_4:  return "#0x4";
		case ARM_ISB_RESERVED_5:  return "#0x5";
		case ARM_ISB_RESERVED_6:  return "#0x6";
		case ARM_ISB_RESERVED_7:  return "#0x7";
		case ARM_ISB_RESERVED_8:  return "#0x8";
		case ARM_ISB_RESERVED_9:  return "#0x9";
		case ARM_ISB_RESERVED_10: return "#0xa";
		case ARM_ISB_RESERVED_11: return "#0xb";
		case ARM_ISB_RESERVED_12: return "#0xc";
		case ARM_ISB_RESERVED_13: return "#0xd";
		case ARM_ISB_RESERVED_14: return "#0xe";
		case ARM_ISB_SY:          return "sy";
	}
}